

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O2

void hiberlite::Database::dbUpdate<X>(bean_key *key,X *bean)

{
  ChildKiller ck;
  BeanUpdater u;
  allocator local_301;
  shared_connection local_300;
  shared_connection local_2f0;
  shared_connection local_2e0;
  bean_key local_2d0;
  bean_key local_2b8;
  string local_2a0;
  string local_280;
  string local_260;
  ChildKiller local_240;
  BeanUpdater local_130;
  
  local_2e0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_2e0.res = (key->con).res;
  if (local_2e0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_2e0.res)->refCount = (local_2e0.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_260,"ROLLBACK TRANSACTION;",(allocator *)&local_240)
  ;
  dbExecQuery(&local_2e0,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_2e0);
  local_2f0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_2f0.res = (key->con).res;
  if (local_2f0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_2f0.res)->refCount = (local_2f0.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_280,"BEGIN TRANSACTION;",(allocator *)&local_240);
  dbExecQuery(&local_2f0,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_2f0);
  ChildKiller::ChildKiller(&local_240);
  bean_key::bean_key(&local_2b8,key);
  ChildKiller::killChildren<X>(&local_240,&local_2b8,bean);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_2b8.con);
  BeanUpdater::BeanUpdater(&local_130);
  bean_key::bean_key(&local_2d0,key);
  BeanUpdater::update<X>(&local_130,&local_2d0,bean);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_2d0.con);
  local_300._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
  local_300.res = (key->con).res;
  if (local_300.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_300.res)->refCount = (local_300.res)->refCount + 1;
  }
  std::__cxx11::string::string((string *)&local_2a0,"COMMIT TRANSACTION;",&local_301);
  dbExecQuery(&local_300,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_300);
  BeanUpdater::~BeanUpdater(&local_130);
  ChildKiller::~ChildKiller(&local_240);
  return;
}

Assistant:

void Database::dbUpdate(bean_key key, C& bean)
{
	try{
		dbExecQuery(key.con,"ROLLBACK TRANSACTION;");
	}catch(...){}
	dbExecQuery(key.con,"BEGIN TRANSACTION;");

		ChildKiller ck;
		ck.killChildren(key,bean);
		BeanUpdater u;
		u.update(key, bean);

	dbExecQuery(key.con,"COMMIT TRANSACTION;");
}